

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::UseNewIdsInBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *block,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *old_ids_to_new_ids)

{
  Instruction *this_00;
  DefUseManager *this_01;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (this_00 = *(Instruction **)
                    ((long)&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        this_00 != &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:244:32)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:244:32)>
               ::_M_manager;
    local_50._M_unused._M_object = old_ids_to_new_ids;
    Instruction::ForEachInId(this_00,(function<void_(unsigned_int_*)> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    this_01 = Pass::get_def_use_mgr(&this->super_Pass);
    analysis::DefUseManager::AnalyzeInstUse(this_01,this_00);
  }
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::UseNewIdsInBlock(
    BasicBlock* block,
    const std::unordered_map<uint32_t, uint32_t>& old_ids_to_new_ids) const {
  for (auto block_itr = block->begin(); block_itr != block->end();
       ++block_itr) {
    (&*block_itr)->ForEachInId([&old_ids_to_new_ids](uint32_t* idp) {
      auto old_ids_to_new_ids_itr = old_ids_to_new_ids.find(*idp);
      if (old_ids_to_new_ids_itr == old_ids_to_new_ids.end()) return;
      *idp = old_ids_to_new_ids_itr->second;
    });
    get_def_use_mgr()->AnalyzeInstUse(&*block_itr);
  }
}